

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

StrList * DirUtils::GetDirFiles(StrList *__return_storage_ptr__,string *p)

{
  char *pcVar1;
  allocator local_61;
  string local_60 [32];
  dirent *local_40;
  dirent *dirp;
  DIR *local_28;
  DIR *dir;
  string *local_18;
  string *p_local;
  StrList *sl;
  
  dir._7_1_ = 0;
  local_18 = p;
  p_local = (string *)__return_storage_ptr__;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_28 = opendir(pcVar1);
  local_40 = (dirent *)0x0;
  while (local_40 = readdir(local_28), local_40 != (dirent *)0x0) {
    pcVar1 = local_40->d_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar1,&local_61);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

StrList DirUtils::GetDirFiles(const string& p){
	StrList sl;
	DIR* dir = opendir(p.c_str());
	struct dirent *dirp = nullptr;
	while((dirp = readdir(dir)) != NULL){
		sl.push_back(string(dirp->d_name));
	}
	return sl;
}